

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_int8(coda_cursor_conflict *cursor,int8_t *dst)

{
  int iVar1;
  char *pcVar2;
  coda_native_type local_24;
  int8_t *piStack_20;
  coda_native_type read_type;
  int8_t *dst_local;
  coda_cursor_conflict *cursor_local;
  
  piStack_20 = dst;
  dst_local = (int8_t *)cursor;
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x6ed);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (int8_t *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x6f2);
    cursor_local._4_4_ = -1;
  }
  else {
    iVar1 = get_read_type(cursor,&local_24);
    if (iVar1 == 0) {
      if (local_24 == coda_native_type_int8) {
        iVar1 = read_int8((coda_cursor_conflict *)dst_local,piStack_20);
        if (iVar1 == 0) {
          cursor_local._4_4_ = 0;
        }
        else {
          cursor_local._4_4_ = -1;
        }
      }
      else {
        pcVar2 = coda_type_get_native_type_name(local_24);
        coda_set_error(-0x69,"can not read %s data using a int8 data type",pcVar2);
        cursor_local._4_4_ = -1;
      }
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_int8(const coda_cursor *cursor, int8_t *dst)
{
    coda_native_type read_type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_read_type(cursor, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int8 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}